

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_enum_lite.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::java::EnumLiteGenerator::~EnumLiteGenerator(EnumLiteGenerator *this)

{
  std::
  _Vector_base<google::protobuf::compiler::java::EnumLiteGenerator::Alias,_std::allocator<google::protobuf::compiler::java::EnumLiteGenerator::Alias>_>
  ::~_Vector_base(&(this->aliases_).
                   super__Vector_base<google::protobuf::compiler::java::EnumLiteGenerator::Alias,_std::allocator<google::protobuf::compiler::java::EnumLiteGenerator::Alias>_>
                 );
  std::
  _Vector_base<const_google::protobuf::EnumValueDescriptor_*,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
  ::~_Vector_base(&(this->canonical_values_).
                   super__Vector_base<const_google::protobuf::EnumValueDescriptor_*,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
                 );
  return;
}

Assistant:

EnumLiteGenerator::~EnumLiteGenerator() {}